

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::enum_to_stem_string::signDisplay
               (UNumberSignDisplay value,UnicodeString *sb)

{
  ConstChar16Ptr local_a8;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  ConstChar16Ptr local_88;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [15];
  
  switch(value) {
  case UNUM_SIGN_AUTO:
    local_78[0].p_ = L"sign-auto";
    UnicodeString::append(sb,local_78,-1);
    break;
  case UNUM_SIGN_ALWAYS:
    local_80.p_ = L"sign-always";
    UnicodeString::append(sb,&local_80,-1);
    break;
  case UNUM_SIGN_NEVER:
    local_88.p_ = L"sign-never";
    UnicodeString::append(sb,&local_88,-1);
    break;
  case UNUM_SIGN_ACCOUNTING:
    local_90.p_ = L"sign-accounting";
    UnicodeString::append(sb,&local_90,-1);
    break;
  case UNUM_SIGN_ACCOUNTING_ALWAYS:
    local_98.p_ = L"sign-accounting-always";
    UnicodeString::append(sb,&local_98,-1);
    break;
  case UNUM_SIGN_EXCEPT_ZERO:
    local_a0.p_ = L"sign-except-zero";
    UnicodeString::append(sb,&local_a0,-1);
    break;
  case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
    local_a8.p_ = L"sign-accounting-except-zero";
    UnicodeString::append(sb,&local_a8,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::signDisplay(UNumberSignDisplay value, UnicodeString& sb) {
    switch (value) {
        case UNUM_SIGN_AUTO:
            sb.append(u"sign-auto", -1);
            break;
        case UNUM_SIGN_ALWAYS:
            sb.append(u"sign-always", -1);
            break;
        case UNUM_SIGN_NEVER:
            sb.append(u"sign-never", -1);
            break;
        case UNUM_SIGN_ACCOUNTING:
            sb.append(u"sign-accounting", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_ALWAYS:
            sb.append(u"sign-accounting-always", -1);
            break;
        case UNUM_SIGN_EXCEPT_ZERO:
            sb.append(u"sign-except-zero", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
            sb.append(u"sign-accounting-except-zero", -1);
            break;
        default:
            U_ASSERT(false);
    }
}